

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgaimage.cpp
# Opt level: O0

bool __thiscall TGAImage::read_tga_file(TGAImage *this,string *filename)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  ulong __n;
  uchar *puVar4;
  allocator<unsigned_char> local_272;
  value_type_conflict local_271;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_270;
  ulong local_258;
  size_t nbytes;
  byte local_248;
  undefined2 local_247;
  undefined2 local_245;
  undefined1 local_243;
  TGA_Header header;
  string local_228 [8];
  ifstream in;
  string *filename_local;
  TGAImage *this_local;
  
  std::ifstream::ifstream(local_228);
  std::ifstream::open(local_228,(_Ios_Openmode)filename);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"can\'t open file ");
    poVar3 = std::operator<<(poVar3,(string *)filename);
    std::operator<<(poVar3,"\n");
    std::ifstream::close();
    this_local._7_1_ = false;
  }
  else {
    nbytes._6_1_ = 0;
    nbytes._7_1_ = 0;
    local_248 = 0;
    local_247 = 0;
    local_245 = 0;
    local_243 = 0;
    header.idlength = '\0';
    header.colormaptype = '\0';
    header._2_2_ = 0;
    header._4_2_ = 0;
    header._6_2_ = 0;
    header.x_origin._0_1_ = 0;
    header.x_origin._1_1_ = 0;
    std::istream::read((char *)local_228,(long)&nbytes + 6);
    bVar1 = std::ios::good();
    if ((bVar1 & 1) == 0) {
      std::ifstream::close();
      std::operator<<((ostream *)&std::cerr,"an error occurred while reading the header\n");
      this_local._7_1_ = false;
    }
    else {
      this->width = (uint)(ushort)header._4_2_;
      this->height = (uint)(ushort)header._6_2_;
      this->bytespp = (int)(uint)(byte)header.x_origin >> 3;
      if (((this->width == 0) || (this->height == 0)) ||
         ((this->bytespp != 1 && ((this->bytespp != 3 && (this->bytespp != 4)))))) {
        std::ifstream::close();
        std::operator<<((ostream *)&std::cerr,"bad bpp (or width/height) value\n");
        this_local._7_1_ = false;
      }
      else {
        __n = (ulong)(this->bytespp * this->width * this->height);
        local_271 = '\0';
        local_258 = __n;
        std::allocator<unsigned_char>::allocator(&local_272);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&local_270,__n,&local_271,&local_272);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&this->data,&local_270);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_270);
        std::allocator<unsigned_char>::~allocator(&local_272);
        if ((local_248 == 3) || (local_248 == 2)) {
          puVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->data);
          std::istream::read((char *)local_228,(long)puVar4);
          bVar1 = std::ios::good();
          if ((bVar1 & 1) == 0) {
            std::ifstream::close();
            std::operator<<((ostream *)&std::cerr,"an error occurred while reading the data\n");
            this_local._7_1_ = false;
            goto LAB_00104f5c;
          }
        }
        else {
          if ((local_248 != 10) && (local_248 != 0xb)) {
            std::ifstream::close();
            poVar3 = std::operator<<((ostream *)&std::cerr,"unknown file format ");
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ulong)local_248);
            std::operator<<(poVar3,"\n");
            this_local._7_1_ = false;
            goto LAB_00104f5c;
          }
          bVar2 = load_rle_data(this,(ifstream *)local_228);
          if (!bVar2) {
            std::ifstream::close();
            std::operator<<((ostream *)&std::cerr,"an error occurred while reading the data\n");
            this_local._7_1_ = false;
            goto LAB_00104f5c;
          }
        }
        if ((header.x_origin._1_1_ & 0x20) == 0) {
          flip_vertically(this);
        }
        if ((header.x_origin._1_1_ & 0x10) != 0) {
          flip_horizontally(this);
        }
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,this->width);
        poVar3 = std::operator<<(poVar3,"x");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->height);
        poVar3 = std::operator<<(poVar3,"/");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->bytespp << 3);
        std::operator<<(poVar3,"\n");
        std::ifstream::close();
        this_local._7_1_ = true;
      }
    }
  }
LAB_00104f5c:
  header.y_origin = 1;
  header.width = 0;
  std::ifstream::~ifstream(local_228);
  return this_local._7_1_;
}

Assistant:

bool TGAImage::read_tga_file(const std::string filename)
{
    std::ifstream in;
    in.open(filename, std::ios::binary);
    if (!in.is_open()) {
        std::cerr << "can't open file " << filename << "\n";
        in.close();
        return false;
    }
    TGA_Header header{};
    in.read(reinterpret_cast<char *>(&header), sizeof(header));
    if (!in.good()) {
        in.close();
        std::cerr << "an error occurred while reading the header\n";
        return false;
    }
    width = header.width;
    height = header.height;
    bytespp = header.bitsperpixel >> 3;
    if (width <= 0 || height <= 0 || (bytespp != GRAYSCALE && bytespp != RGB && bytespp != RGBA)) {
        in.close();
        std::cerr << "bad bpp (or width/height) value\n";
        return false;
    }
    size_t nbytes = bytespp * width * height;
    data = std::vector<std::uint8_t>(nbytes, 0);
    if (3 == header.datatypecode || 2 == header.datatypecode) {
        in.read(reinterpret_cast<char *>(data.data()), nbytes);
        if (!in.good()) {
            in.close();
            std::cerr << "an error occurred while reading the data\n";
            return false;
        }
    } else if (10 == header.datatypecode || 11 == header.datatypecode) {
        if (!load_rle_data(in)) {
            in.close();
            std::cerr << "an error occurred while reading the data\n";
            return false;
        }
    } else {
        in.close();
        std::cerr << "unknown file format " << (size_t)header.datatypecode << "\n";
        return false;
    }
    if (!(header.imagedescriptor & 0x20)) flip_vertically();
    if (header.imagedescriptor & 0x10) flip_horizontally();
    std::cerr << width << "x" << height << "/" << bytespp * 8 << "\n";
    in.close();
    return true;
}